

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JP2K.cpp
# Opt level: O2

char * ASDCP::JP2K::GetMarkerString(Marker_t m)

{
  switch(m) {
  case MRK_SOC:
    return "SOC: Start of codestream";
  case MRK_CAP:
    return "CAP: Capabilities";
  case MRK_SIZ:
    return "SIZ: Image and tile size";
  case MRK_COD:
    return "COD: Coding style default";
  case MRK_COC:
    return "COC: Coding style component";
  case 0xff54:
  case 0xff5a:
  case 0xff5b:
  case 0xff62:
    goto switchD_0018fc8c_caseD_ff54;
  case MRK_TLM:
    return "TLM: Tile-part lengths";
  case MRK_PRF:
    return "PRF: Profile";
  case MRK_PLM:
    return "PLM: Packet length, main header";
  case MRK_PLT:
    return "PLT: Packet length, tile-part header";
  case MRK_CPF:
    return "CPF: Corresponding profile";
  case MRK_QCD:
    return "QCD: Quantization default";
  case MRK_QCC:
    return "QCC: Quantization component";
  case MRK_RGN:
    return "RGN: Region of interest";
  case MRK_POC:
    return "POC: Progression order change";
  case MRK_PPM:
    return "PPM: Packed packet headers, main header";
  case MRK_PPT:
    return "PPT: Packed packet headers, tile-part header";
  case MRK_CRG:
    return "CRG: Component registration";
  case MRK_COM:
    return "COM: Comment";
  default:
    switch(m) {
    case MRK_SOT:
      return "SOT: Start of tile-part";
    case MRK_SOP:
      return "SOP: Start of packet";
    case MRK_EPH:
      return "EPH: End of packet header";
    case MRK_SOD:
      return "SOD: Start of data";
    }
    if (m == MRK_NIL) {
      return "NIL";
    }
    if (m == MRK_EOC) {
      return "EOC: End of codestream";
    }
switchD_0018fc8c_caseD_ff54:
    return "Unknown marker code";
  }
}

Assistant:

const char*
ASDCP::JP2K::GetMarkerString(Marker_t m)
{
  switch ( m )
    {
    case MRK_NIL: return "NIL"; break;
    case MRK_SOC: return "SOC: Start of codestream"; break;
    case MRK_SOT: return "SOT: Start of tile-part"; break;
    case MRK_SOD: return "SOD: Start of data"; break;
    case MRK_EOC: return "EOC: End of codestream"; break;
    case MRK_SIZ: return "SIZ: Image and tile size"; break;
    case MRK_COD: return "COD: Coding style default"; break;
    case MRK_COC: return "COC: Coding style component"; break;
    case MRK_RGN: return "RGN: Region of interest"; break;
    case MRK_QCD: return "QCD: Quantization default"; break;
    case MRK_QCC: return "QCC: Quantization component"; break;
    case MRK_POC: return "POC: Progression order change"; break;
    case MRK_TLM: return "TLM: Tile-part lengths"; break;
    case MRK_PLM: return "PLM: Packet length, main header"; break;
    case MRK_PLT: return "PLT: Packet length, tile-part header"; break;
    case MRK_PPM: return "PPM: Packed packet headers, main header"; break;
    case MRK_PPT: return "PPT: Packed packet headers, tile-part header"; break;
    case MRK_SOP: return "SOP: Start of packet"; break;
    case MRK_EPH: return "EPH: End of packet header"; break;
    case MRK_CRG: return "CRG: Component registration"; break;
    case MRK_COM: return "COM: Comment"; break;
    case MRK_CPF: return "CPF: Corresponding profile"; break;
    case MRK_CAP: return "CAP: Capabilities"; break;
    case MRK_PRF: return "PRF: Profile"; break;
    }

  return "Unknown marker code";
}